

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void P_SectorDamage(int tag,int amount,FName *type,PClassActor *protectClass,int flags)

{
  sector_t_conflict *sec;
  double dVar1;
  uint uVar2;
  ulong uVar3;
  AActor *pAVar4;
  AActor *pAVar5;
  double dVar6;
  double dVar7;
  FSectorTagIterator itr;
  FName local_68;
  FName local_64;
  FName *local_60;
  PClassActor *local_58;
  FSectorTagIterator local_50;
  sector_t_conflict *local_48;
  ulong local_40;
  double local_38;
  
  if (tag == 0) {
    local_50.start = 0;
  }
  else {
    local_50.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
  }
  local_60 = type;
  local_58 = protectClass;
  local_50.searchtag = tag;
  while( true ) {
    uVar2 = FSectorTagIterator::Next(&local_50);
    if ((int)uVar2 < 0) break;
    sec = sectors + uVar2;
    pAVar5 = sectors[uVar2].thinglist;
    while (pAVar5 != (AActor *)0x0) {
      pAVar4 = pAVar5->snext;
      local_64.Index = local_60->Index;
      DoSectorDamage(pAVar5,(sector_t *)sec,amount,&local_64,local_58,flags);
      pAVar5 = pAVar4;
    }
    uVar3 = 0;
    local_48 = sec;
    while (uVar3 < (local_48->e->XFloor).attached.Count) {
      pAVar5 = (local_48->e->XFloor).attached.Array[uVar3]->thinglist;
      local_40 = uVar3;
      while (pAVar4 = pAVar5, pAVar4 != (AActor *)0x0) {
        pAVar5 = pAVar4->snext;
        local_38 = secplane_t::ZatPoint(&sec->floorplane,pAVar4);
        dVar6 = secplane_t::ZatPoint(&sec->ceilingplane,pAVar4);
        dVar7 = dVar6;
        if (local_38 <= dVar6) {
          dVar7 = local_38;
        }
        dVar1 = (pAVar4->__Pos).Z;
        if (dVar7 < pAVar4->Height + dVar1) {
          dVar7 = local_38;
          if (local_38 <= dVar6) {
            dVar7 = dVar6;
          }
          if (((flags & 4U) != 0) || (dVar1 <= dVar7 + 1.52587890625e-05)) {
            local_68.Index = local_60->Index;
            DoSectorDamage(pAVar4,(sector_t *)0x0,amount,&local_68,local_58,flags | 4);
          }
        }
      }
      uVar3 = local_40 + 1;
    }
  }
  return;
}

Assistant:

void P_SectorDamage(int tag, int amount, FName type, PClassActor *protectClass, int flags)
{
	FSectorTagIterator itr(tag);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		AActor *actor, *next;
		sector_t *sec = &sectors[secnum];

		// Do for actors in this sector.
		for (actor = sec->thinglist; actor != NULL; actor = next)
		{
			next = actor->snext;
			DoSectorDamage(actor, sec, amount, type, protectClass, flags);
		}
		// If this is a 3D floor control sector, also do for anything in/on
		// those 3D floors.
		for (unsigned i = 0; i < sec->e->XFloor.attached.Size(); ++i)
		{
			sector_t *sec2 = sec->e->XFloor.attached[i];

			for (actor = sec2->thinglist; actor != NULL; actor = next)
			{
				next = actor->snext;
				// Only affect actors touching the 3D floor
				double z1 = sec->floorplane.ZatPoint(actor);
				double z2 = sec->ceilingplane.ZatPoint(actor);
				if (z2 < z1)
				{
					// Account for Vavoom-style 3D floors
					double zz = z1;
					z1 = z2;
					z2 = zz;
				}
				if (actor->Top() > z1)
				{
					// If DAMAGE_IN_AIR is used, anything not beneath the 3D floor will be
					// damaged (so, anything touching it or above it). Other 3D floors between
					// the actor and this one will not stop this effect.
					if ((flags & DAMAGE_IN_AIR) || !actor->isAbove(z2))
					{
						// Here we pass the DAMAGE_IN_AIR flag to disable the floor check, since it
						// only works with the real sector's floor. We did the appropriate height checks
						// for 3D floors already.
						DoSectorDamage(actor, NULL, amount, type, protectClass, flags | DAMAGE_IN_AIR);
					}
				}
			}
		}
	}
}